

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  ulong uVar12;
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong unaff_RBX;
  size_t mask;
  NodeRef *pNVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  size_t local_9e0;
  ulong local_9d8;
  ulong local_9d0;
  NodeRef *local_9c8;
  Scene *local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  undefined1 local_9a8 [16];
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_978 [16];
  undefined1 local_968 [16];
  undefined1 local_958 [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint uStack_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar59 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar60 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar61 = ZEXT1664(auVar26);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 0.99999964)));
  auVar62 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 0.99999964)));
  auVar63 = ZEXT1664(auVar26);
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 0.99999964)));
  auVar64 = ZEXT1664(auVar26);
  auVar27 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar2 * 1.0000004)));
  auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar3 * 1.0000004)));
  auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar4 * 1.0000004)));
  uVar17 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar15 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_9b0 = uVar18 ^ 0x10;
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar31 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  local_9b8 = uVar15 ^ 0x10;
  auVar26 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  pNVar16 = stack + 1;
  do {
    local_9c8 = pNVar16;
    if (local_9c8 == stack) break;
    pNVar16 = local_9c8 + -1;
    sVar20 = local_9c8[-1].ptr;
    do {
      if ((sVar20 & 8) == 0) {
        uVar13 = sVar20 & 0xfffffffffffffff0;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar40._4_4_ = uVar5;
        auVar40._0_4_ = uVar5;
        auVar40._8_4_ = uVar5;
        auVar40._12_4_ = uVar5;
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar17),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar17));
        auVar32 = vsubps_avx512vl(auVar32,auVar59._0_16_);
        auVar32 = vmulps_avx512vl(auVar62._0_16_,auVar32);
        auVar33 = vmaxps_avx512vl(auVar30,auVar32);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar18),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar18));
        auVar32 = vsubps_avx512vl(auVar32,auVar60._0_16_);
        auVar34 = vmulps_avx512vl(auVar63._0_16_,auVar32);
        auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + uVar15),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + uVar15));
        auVar32 = vsubps_avx512vl(auVar32,auVar61._0_16_);
        auVar32 = vmulps_avx512vl(auVar64._0_16_,auVar32);
        auVar32 = vmaxps_avx(auVar34,auVar32);
        auVar32 = vmaxps_avx(auVar33,auVar32);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + (uVar17 ^ 0x10)),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + (uVar17 ^ 0x10)));
        auVar33 = vsubps_avx512vl(auVar33,auVar59._0_16_);
        auVar33 = vmulps_avx512vl(auVar27,auVar33);
        auVar34 = vminps_avx512vl(auVar31,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9b0),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_9b0));
        auVar33 = vsubps_avx512vl(auVar33,auVar60._0_16_);
        auVar35 = vmulps_avx512vl(auVar28,auVar33);
        auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x80 + local_9b8),auVar40,
                                  *(undefined1 (*) [16])(uVar13 + 0x20 + local_9b8));
        auVar33 = vsubps_avx512vl(auVar33,auVar61._0_16_);
        auVar33 = vmulps_avx512vl(auVar29,auVar33);
        auVar33 = vminps_avx(auVar35,auVar33);
        auVar33 = vminps_avx(auVar34,auVar33);
        uVar10 = vcmpps_avx512vl(auVar32,auVar33,2);
        bVar24 = (byte)uVar10;
        if (((uint)sVar20 & 7) == 6) {
          uVar10 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(uVar13 + 0xf0),1);
          uVar11 = vcmpps_avx512vl(auVar40,*(undefined1 (*) [16])(uVar13 + 0xe0),0xd);
          bVar24 = (byte)uVar10 & (byte)uVar11 & bVar24;
        }
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)bVar24);
      }
      if ((sVar20 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar21 = 4;
        }
        else {
          uVar19 = sVar20 & 0xfffffffffffffff0;
          lVar14 = 0;
          for (uVar13 = unaff_RBX; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            lVar14 = lVar14 + 1;
          }
          uVar21 = 0;
          for (uVar13 = unaff_RBX - 1 & unaff_RBX; sVar20 = *(size_t *)(uVar19 + lVar14 * 8),
              uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
            pNVar16->ptr = sVar20;
            pNVar16 = pNVar16 + 1;
            lVar14 = 0;
            for (uVar12 = uVar13; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
              lVar14 = lVar14 + 1;
            }
          }
        }
      }
      else {
        uVar21 = 6;
      }
    } while (uVar21 == 0);
    if (uVar21 == 6) {
      uVar21 = 0;
      local_9d8 = (ulong)((uint)sVar20 & 0xf) - 8;
      bVar22 = local_9d8 != 0;
      if (bVar22) {
        uVar13 = sVar20 & 0xfffffffffffffff0;
        local_9d0 = 0;
        do {
          lVar14 = local_9d0 * 0x140;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar44._4_4_ = uVar5;
          auVar44._0_4_ = uVar5;
          auVar44._8_4_ = uVar5;
          auVar44._12_4_ = uVar5;
          auVar32 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x90 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + lVar14));
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xa0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x10 + lVar14));
          auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xb0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x20 + lVar14));
          auVar35 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xc0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x30 + lVar14));
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xd0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x40 + lVar14));
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xe0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x50 + lVar14));
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xf0 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x60 + lVar14));
          auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x100 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x70 + lVar14));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x110 + lVar14),auVar44,
                                    *(undefined1 (*) [16])(uVar13 + 0x80 + lVar14));
          uVar5 = *(undefined4 *)(ray + k * 4);
          auVar45._4_4_ = uVar5;
          auVar45._0_4_ = uVar5;
          auVar45._8_4_ = uVar5;
          auVar45._12_4_ = uVar5;
          auVar36 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar37 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar55._4_4_ = uVar5;
          auVar55._0_4_ = uVar5;
          auVar55._8_4_ = uVar5;
          auVar55._12_4_ = uVar5;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar57._4_4_ = uVar5;
          auVar57._0_4_ = uVar5;
          auVar57._8_4_ = uVar5;
          auVar57._12_4_ = uVar5;
          fVar2 = *(float *)(ray + k * 4 + 0x60);
          auVar58._4_4_ = fVar2;
          auVar58._0_4_ = fVar2;
          auVar58._8_4_ = fVar2;
          auVar58._12_4_ = fVar2;
          auVar32 = vsubps_avx(auVar32,auVar45);
          auVar38 = vsubps_avx512vl(auVar33,auVar36);
          auVar39 = vsubps_avx512vl(auVar34,auVar37);
          auVar35 = vsubps_avx512vl(auVar35,auVar45);
          auVar40 = vsubps_avx512vl(auVar40,auVar36);
          auVar41 = vsubps_avx512vl(auVar41,auVar37);
          auVar42 = vsubps_avx512vl(auVar42,auVar45);
          auVar43 = vsubps_avx512vl(auVar43,auVar36);
          auVar44 = vsubps_avx512vl(auVar44,auVar37);
          auVar36 = vsubps_avx512vl(auVar42,auVar32);
          auVar33 = vsubps_avx(auVar43,auVar38);
          auVar37 = vsubps_avx512vl(auVar44,auVar39);
          auVar45 = vsubps_avx512vl(auVar32,auVar35);
          auVar46 = vsubps_avx512vl(auVar38,auVar40);
          auVar47 = vsubps_avx512vl(auVar39,auVar41);
          auVar48 = vsubps_avx512vl(auVar35,auVar42);
          auVar49 = vsubps_avx512vl(auVar40,auVar43);
          auVar50 = vsubps_avx512vl(auVar41,auVar44);
          auVar34 = vaddps_avx512vl(auVar42,auVar32);
          auVar56._0_4_ = auVar43._0_4_ + auVar38._0_4_;
          auVar56._4_4_ = auVar43._4_4_ + auVar38._4_4_;
          auVar56._8_4_ = auVar43._8_4_ + auVar38._8_4_;
          auVar56._12_4_ = auVar43._12_4_ + auVar38._12_4_;
          auVar51 = vaddps_avx512vl(auVar44,auVar39);
          auVar52 = vmulps_avx512vl(auVar56,auVar37);
          auVar52 = vfmsub231ps_avx512vl(auVar52,auVar33,auVar51);
          auVar51 = vmulps_avx512vl(auVar51,auVar36);
          auVar51 = vfmsub231ps_avx512vl(auVar51,auVar37,auVar34);
          auVar53._0_4_ = auVar33._0_4_ * auVar34._0_4_;
          auVar53._4_4_ = auVar33._4_4_ * auVar34._4_4_;
          auVar53._8_4_ = auVar33._8_4_ * auVar34._8_4_;
          auVar53._12_4_ = auVar33._12_4_ * auVar34._12_4_;
          auVar34 = vfmsub231ps_fma(auVar53,auVar36,auVar56);
          auVar54._0_4_ = fVar2 * auVar34._0_4_;
          auVar54._4_4_ = fVar2 * auVar34._4_4_;
          auVar54._8_4_ = fVar2 * auVar34._8_4_;
          auVar54._12_4_ = fVar2 * auVar34._12_4_;
          auVar34 = vfmadd231ps_avx512vl(auVar54,auVar57,auVar51);
          auVar51 = vfmadd231ps_avx512vl(auVar34,auVar55,auVar52);
          auVar34 = vaddps_avx512vl(auVar32,auVar35);
          auVar52 = vaddps_avx512vl(auVar38,auVar40);
          auVar53 = vaddps_avx512vl(auVar39,auVar41);
          auVar54 = vmulps_avx512vl(auVar52,auVar47);
          auVar54 = vfmsub231ps_avx512vl(auVar54,auVar46,auVar53);
          auVar53 = vmulps_avx512vl(auVar53,auVar45);
          auVar53 = vfmsub231ps_avx512vl(auVar53,auVar47,auVar34);
          auVar34 = vmulps_avx512vl(auVar34,auVar46);
          auVar34 = vfmsub231ps_avx512vl(auVar34,auVar45,auVar52);
          auVar52._0_4_ = fVar2 * auVar34._0_4_;
          auVar52._4_4_ = fVar2 * auVar34._4_4_;
          auVar52._8_4_ = fVar2 * auVar34._8_4_;
          auVar52._12_4_ = fVar2 * auVar34._12_4_;
          auVar34 = vfmadd231ps_avx512vl(auVar52,auVar57,auVar53);
          auVar52 = vfmadd231ps_avx512vl(auVar34,auVar55,auVar54);
          auVar34 = vaddps_avx512vl(auVar35,auVar42);
          auVar35 = vaddps_avx512vl(auVar40,auVar43);
          auVar40 = vaddps_avx512vl(auVar41,auVar44);
          auVar41 = vmulps_avx512vl(auVar35,auVar50);
          auVar41 = vfmsub231ps_avx512vl(auVar41,auVar49,auVar40);
          auVar40 = vmulps_avx512vl(auVar40,auVar48);
          auVar40 = vfmsub231ps_avx512vl(auVar40,auVar50,auVar34);
          auVar34 = vmulps_avx512vl(auVar34,auVar49);
          auVar34 = vfmsub231ps_avx512vl(auVar34,auVar48,auVar35);
          auVar34 = vmulps_avx512vl(auVar34,auVar58);
          auVar34 = vfmadd231ps_avx512vl(auVar34,auVar57,auVar40);
          auVar40 = vfmadd231ps_avx512vl(auVar34,auVar55,auVar41);
          auVar42._0_4_ = auVar51._0_4_ + auVar52._0_4_;
          auVar42._4_4_ = auVar51._4_4_ + auVar52._4_4_;
          auVar42._8_4_ = auVar51._8_4_ + auVar52._8_4_;
          auVar42._12_4_ = auVar51._12_4_ + auVar52._12_4_;
          auVar42 = vaddps_avx512vl(auVar40,auVar42);
          auVar34._8_4_ = 0x7fffffff;
          auVar34._0_8_ = 0x7fffffff7fffffff;
          auVar34._12_4_ = 0x7fffffff;
          auVar34 = vandps_avx512vl(auVar42,auVar34);
          auVar35._8_4_ = 0x34000000;
          auVar35._0_8_ = 0x3400000034000000;
          auVar35._12_4_ = 0x34000000;
          auVar35 = vmulps_avx512vl(auVar34,auVar35);
          auVar41 = vminps_avx512vl(auVar51,auVar52);
          auVar43 = vminps_avx512vl(auVar41,auVar40);
          auVar41._8_4_ = 0x80000000;
          auVar41._0_8_ = 0x8000000080000000;
          auVar41._12_4_ = 0x80000000;
          auVar41 = vxorps_avx512vl(auVar35,auVar41);
          uVar10 = vcmpps_avx512vl(auVar43,auVar41,5);
          auVar41 = vmaxps_avx512vl(auVar51,auVar52);
          auVar40 = vmaxps_avx512vl(auVar41,auVar40);
          uVar11 = vcmpps_avx512vl(auVar40,auVar35,2);
          bVar24 = ((byte)uVar10 | (byte)uVar11) & 0xf;
          if (bVar24 != 0) {
            auVar35 = vmulps_avx512vl(auVar46,auVar37);
            auVar40 = vmulps_avx512vl(auVar36,auVar47);
            auVar41 = vmulps_avx512vl(auVar45,auVar33);
            auVar43 = vmulps_avx512vl(auVar49,auVar47);
            auVar44 = vmulps_avx512vl(auVar45,auVar50);
            auVar53 = vmulps_avx512vl(auVar48,auVar46);
            auVar33 = vfmsub213ps_avx512vl(auVar33,auVar47,auVar35);
            auVar37 = vfmsub213ps_avx512vl(auVar37,auVar45,auVar40);
            auVar36 = vfmsub213ps_avx512vl(auVar36,auVar46,auVar41);
            auVar46 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar43);
            auVar47 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar44);
            auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar53);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar35 = vandps_avx512vl(auVar35,auVar48);
            auVar43 = vandps_avx512vl(auVar43,auVar48);
            uVar19 = vcmpps_avx512vl(auVar35,auVar43,1);
            auVar35 = vandps_avx512vl(auVar40,auVar48);
            auVar40 = vandps_avx512vl(auVar44,auVar48);
            uVar12 = vcmpps_avx512vl(auVar35,auVar40,1);
            auVar35 = vandps_avx512vl(auVar41,auVar48);
            auVar40 = vandps_avx512vl(auVar53,auVar48);
            uVar25 = vcmpps_avx512vl(auVar35,auVar40,1);
            bVar23 = (bool)((byte)uVar19 & 1);
            local_898._0_4_ = (uint)bVar23 * auVar33._0_4_ | (uint)!bVar23 * auVar46._0_4_;
            bVar23 = (bool)((byte)(uVar19 >> 1) & 1);
            local_898._4_4_ = (uint)bVar23 * auVar33._4_4_ | (uint)!bVar23 * auVar46._4_4_;
            bVar23 = (bool)((byte)(uVar19 >> 2) & 1);
            local_898._8_4_ = (uint)bVar23 * auVar33._8_4_ | (uint)!bVar23 * auVar46._8_4_;
            bVar23 = (bool)((byte)(uVar19 >> 3) & 1);
            local_898._12_4_ = (uint)bVar23 * auVar33._12_4_ | (uint)!bVar23 * auVar46._12_4_;
            bVar23 = (bool)((byte)uVar12 & 1);
            local_888._0_4_ = (uint)bVar23 * auVar37._0_4_ | (uint)!bVar23 * auVar47._0_4_;
            bVar23 = (bool)((byte)(uVar12 >> 1) & 1);
            local_888._4_4_ = (uint)bVar23 * auVar37._4_4_ | (uint)!bVar23 * auVar47._4_4_;
            bVar23 = (bool)((byte)(uVar12 >> 2) & 1);
            local_888._8_4_ = (uint)bVar23 * auVar37._8_4_ | (uint)!bVar23 * auVar47._8_4_;
            bVar23 = (bool)((byte)(uVar12 >> 3) & 1);
            local_888._12_4_ = (uint)bVar23 * auVar37._12_4_ | (uint)!bVar23 * auVar47._12_4_;
            bVar23 = (bool)((byte)uVar25 & 1);
            local_878._0_4_ = (float)((uint)bVar23 * auVar36._0_4_ | (uint)!bVar23 * auVar45._0_4_);
            bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
            local_878._4_4_ = (float)((uint)bVar23 * auVar36._4_4_ | (uint)!bVar23 * auVar45._4_4_);
            bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
            local_878._8_4_ = (float)((uint)bVar23 * auVar36._8_4_ | (uint)!bVar23 * auVar45._8_4_);
            bVar23 = (bool)((byte)(uVar25 >> 3) & 1);
            local_878._12_4_ =
                 (float)((uint)bVar23 * auVar36._12_4_ | (uint)!bVar23 * auVar45._12_4_);
            auVar46._0_4_ = fVar2 * local_878._0_4_;
            auVar46._4_4_ = fVar2 * local_878._4_4_;
            auVar46._8_4_ = fVar2 * local_878._8_4_;
            auVar46._12_4_ = fVar2 * local_878._12_4_;
            auVar33 = vfmadd213ps_fma(auVar57,local_888,auVar46);
            auVar33 = vfmadd213ps_fma(auVar55,local_898,auVar33);
            auVar36._0_4_ = auVar33._0_4_ + auVar33._0_4_;
            auVar36._4_4_ = auVar33._4_4_ + auVar33._4_4_;
            auVar36._8_4_ = auVar33._8_4_ + auVar33._8_4_;
            auVar36._12_4_ = auVar33._12_4_ + auVar33._12_4_;
            auVar37._0_4_ = auVar39._0_4_ * local_878._0_4_;
            auVar37._4_4_ = auVar39._4_4_ * local_878._4_4_;
            auVar37._8_4_ = auVar39._8_4_ * local_878._8_4_;
            auVar37._12_4_ = auVar39._12_4_ * local_878._12_4_;
            auVar33 = vfmadd213ps_fma(auVar38,local_888,auVar37);
            auVar33 = vfmadd213ps_fma(auVar32,local_898,auVar33);
            auVar35 = vrcp14ps_avx512vl(auVar36);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = &DAT_3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar32 = vfnmadd213ps_avx512vl(auVar35,auVar36,auVar32);
            auVar32 = vfmadd132ps_fma(auVar32,auVar35,auVar35);
            local_8a8._0_4_ = auVar32._0_4_ * (auVar33._0_4_ + auVar33._0_4_);
            local_8a8._4_4_ = auVar32._4_4_ * (auVar33._4_4_ + auVar33._4_4_);
            local_8a8._8_4_ = auVar32._8_4_ * (auVar33._8_4_ + auVar33._8_4_);
            local_8a8._12_4_ = auVar32._12_4_ * (auVar33._12_4_ + auVar33._12_4_);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar33._4_4_ = uVar5;
            auVar33._0_4_ = uVar5;
            auVar33._8_4_ = uVar5;
            auVar33._12_4_ = uVar5;
            uVar10 = vcmpps_avx512vl(local_8a8,auVar33,2);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar43._4_4_ = uVar5;
            auVar43._0_4_ = uVar5;
            auVar43._8_4_ = uVar5;
            auVar43._12_4_ = uVar5;
            uVar11 = vcmpps_avx512vl(local_8a8,auVar43,0xd);
            bVar24 = (byte)uVar10 & (byte)uVar11 & bVar24;
            if (bVar24 != 0) {
              uVar10 = vcmpps_avx512vl(auVar36,_DAT_01feba10,4);
              bVar24 = bVar24 & (byte)uVar10;
              if (bVar24 != 0) {
                local_9c0 = context->scene;
                auVar38._8_4_ = 0x219392ef;
                auVar38._0_8_ = 0x219392ef219392ef;
                auVar38._12_4_ = 0x219392ef;
                uVar19 = vcmpps_avx512vl(auVar34,auVar38,5);
                auVar33 = vrcp14ps_avx512vl(auVar42);
                auVar48._8_4_ = 0x3f800000;
                auVar48._0_8_ = &DAT_3f8000003f800000;
                auVar48._12_4_ = 0x3f800000;
                auVar32 = vfnmadd213ps_fma(auVar42,auVar33,auVar48);
                auVar32 = vfmadd132ps_avx512vl(auVar32,auVar33,auVar33);
                fVar2 = (float)((uint)((byte)uVar19 & 1) * auVar32._0_4_);
                fVar3 = (float)((uint)((byte)(uVar19 >> 1) & 1) * auVar32._4_4_);
                fVar4 = (float)((uint)((byte)(uVar19 >> 2) & 1) * auVar32._8_4_);
                fVar1 = (float)((uint)((byte)(uVar19 >> 3) & 1) * auVar32._12_4_);
                auVar39._0_4_ = fVar2 * auVar51._0_4_;
                auVar39._4_4_ = fVar3 * auVar51._4_4_;
                auVar39._8_4_ = fVar4 * auVar51._8_4_;
                auVar39._12_4_ = fVar1 * auVar51._12_4_;
                local_8c8 = vminps_avx(auVar39,auVar48);
                auVar47._0_4_ = fVar2 * auVar52._0_4_;
                auVar47._4_4_ = fVar3 * auVar52._4_4_;
                auVar47._8_4_ = fVar4 * auVar52._8_4_;
                auVar47._12_4_ = fVar1 * auVar52._12_4_;
                local_8b8 = vminps_avx(auVar47,auVar48);
                uVar19 = (ulong)bVar24;
                do {
                  uVar12 = 0;
                  for (uVar25 = uVar19; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000
                      ) {
                    uVar12 = uVar12 + 1;
                  }
                  pGVar8 = (local_9c0->geometries).items
                           [*(uint *)(lVar14 + uVar13 + 0x120 + uVar12 * 4)].ptr;
                  if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar19 = uVar19 ^ 1L << (uVar12 & 0x3f);
                    bVar23 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar23 = false;
                  }
                  else {
                    uVar25 = (ulong)(uint)((int)uVar12 * 4);
                    uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar6 = *(undefined4 *)(local_8c8 + uVar25);
                    local_838._4_4_ = uVar6;
                    local_838._0_4_ = uVar6;
                    local_838._8_4_ = uVar6;
                    local_838._12_4_ = uVar6;
                    uVar6 = *(undefined4 *)(local_8b8 + uVar25);
                    local_828._4_4_ = uVar6;
                    local_828._0_4_ = uVar6;
                    local_828._8_4_ = uVar6;
                    local_828._12_4_ = uVar6;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar25);
                    args.context = context->user;
                    local_808 = vpbroadcastd_avx512vl();
                    uVar6 = *(undefined4 *)(lVar14 + uVar13 + 0x130 + uVar25);
                    local_818._4_4_ = uVar6;
                    local_818._0_4_ = uVar6;
                    local_818._8_4_ = uVar6;
                    local_818._12_4_ = uVar6;
                    uVar6 = *(undefined4 *)(local_898 + uVar25);
                    uVar7 = *(undefined4 *)(local_888 + uVar25);
                    local_858._4_4_ = uVar7;
                    local_858._0_4_ = uVar7;
                    local_858._8_4_ = uVar7;
                    local_858._12_4_ = uVar7;
                    uVar7 = *(undefined4 *)(local_878 + uVar25);
                    local_848._4_4_ = uVar7;
                    local_848._0_4_ = uVar7;
                    local_848._8_4_ = uVar7;
                    local_848._12_4_ = uVar7;
                    local_868[0] = (RTCHitN)(char)uVar6;
                    local_868[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar6;
                    local_868[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar6;
                    local_868[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar6;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
                    vpcmpeqd_avx2(ZEXT1632(local_808),ZEXT1632(local_808));
                    uStack_7f4 = (args.context)->instID[0];
                    local_7f8 = uStack_7f4;
                    uStack_7f0 = uStack_7f4;
                    uStack_7ec = uStack_7f4;
                    uStack_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = uStack_7e8;
                    uStack_7e0 = uStack_7e8;
                    uStack_7dc = uStack_7e8;
                    local_918 = auVar26._0_8_;
                    uStack_910 = auVar26._8_8_;
                    local_9f8 = local_918;
                    uStack_9f0 = uStack_910;
                    args.valid = (int *)&local_9f8;
                    args.geometryUserPtr = pGVar8->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    local_958 = auVar59._0_16_;
                    local_968 = auVar60._0_16_;
                    local_978 = auVar61._0_16_;
                    local_988 = auVar62._0_16_;
                    local_998 = auVar63._0_16_;
                    local_9a8 = auVar64._0_16_;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_9e0 = k;
                      (*pGVar8->occlusionFilterN)(&args);
                      auVar64 = ZEXT1664(local_9a8);
                      auVar63 = ZEXT1664(local_998);
                      auVar62 = ZEXT1664(local_988);
                      auVar61 = ZEXT1664(local_978);
                      auVar60 = ZEXT1664(local_968);
                      auVar59 = ZEXT1664(local_958);
                      k = local_9e0;
                    }
                    auVar49._8_8_ = uStack_9f0;
                    auVar49._0_8_ = local_9f8;
                    uVar25 = vptestmd_avx512vl(auVar49,auVar49);
                    if ((uVar25 & 0xf) == 0) {
                      bVar23 = true;
                    }
                    else {
                      p_Var9 = context->args->filter;
                      if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var9)(&args);
                        auVar64 = ZEXT1664(local_9a8);
                        auVar63 = ZEXT1664(local_998);
                        auVar62 = ZEXT1664(local_988);
                        auVar61 = ZEXT1664(local_978);
                        auVar60 = ZEXT1664(local_968);
                        auVar59 = ZEXT1664(local_958);
                      }
                      auVar50._8_8_ = uStack_9f0;
                      auVar50._0_8_ = local_9f8;
                      uVar25 = vptestmd_avx512vl(auVar50,auVar50);
                      uVar25 = uVar25 & 0xf;
                      auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar23 = (bool)((byte)uVar25 & 1);
                      auVar51._0_4_ =
                           (uint)bVar23 * auVar32._0_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x80);
                      bVar23 = (bool)((byte)(uVar25 >> 1) & 1);
                      auVar51._4_4_ =
                           (uint)bVar23 * auVar32._4_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x84);
                      bVar23 = (bool)((byte)(uVar25 >> 2) & 1);
                      auVar51._8_4_ =
                           (uint)bVar23 * auVar32._8_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x88);
                      bVar23 = SUB81(uVar25 >> 3,0);
                      auVar51._12_4_ =
                           (uint)bVar23 * auVar32._12_4_ | (uint)!bVar23 * *(int *)(args.ray + 0x8c)
                      ;
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar51;
                      bVar23 = (byte)uVar25 == 0;
                    }
                    if (bVar23) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar5;
                      uVar19 = uVar19 ^ 1L << (uVar12 & 0x3f);
                    }
                  }
                  if (!bVar23) {
                    if (bVar22) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar21 = 1;
                    }
                    goto LAB_00768785;
                  }
                } while (uVar19 != 0);
              }
            }
          }
          local_9d0 = local_9d0 + 1;
          bVar22 = local_9d0 < local_9d8;
        } while (local_9d0 != local_9d8);
      }
    }
LAB_00768785:
  } while ((uVar21 & 3) == 0);
  return local_9c8 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }